

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O1

set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
* anon_unknown.dwarf_8ee020::GetKeyOriginData
            (set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
             *__return_storage_ptr__,FlatSigningProvider *provider,int flags)

{
  _Base_ptr *__v;
  void *pvVar1;
  bool bVar2;
  byte bVar3;
  _Base_ptr p_Var4;
  byte bVar5;
  size_t __n;
  iterator in_R8;
  iterator in_R9;
  _Rb_tree_header *p_Var6;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined4 local_150;
  undefined4 local_14c;
  lazy_ostream local_148;
  undefined1 *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined4 *local_108;
  undefined4 *local_100;
  char *local_f8;
  char *local_f0;
  assertion_result local_e8;
  KeyOriginInfo norm_origin;
  CPubKey norm_pubkey;
  uchar bytes [33];
  uchar local_47 [15];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var6 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var6->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = (provider->origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(provider->origins)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    do {
      __v = &p_Var4[1]._M_right;
      if ((flags & 0x40U) == 0) {
        std::
        _Rb_tree<std::pair<CPubKey,KeyOriginInfo>,std::pair<CPubKey,KeyOriginInfo>,std::_Identity<std::pair<CPubKey,KeyOriginInfo>>,std::less<std::pair<CPubKey,KeyOriginInfo>>,std::allocator<std::pair<CPubKey,KeyOriginInfo>>>
        ::_M_insert_unique<std::pair<CPubKey,KeyOriginInfo>const&>
                  ((_Rb_tree<std::pair<CPubKey,KeyOriginInfo>,std::pair<CPubKey,KeyOriginInfo>,std::_Identity<std::pair<CPubKey,KeyOriginInfo>>,std::less<std::pair<CPubKey,KeyOriginInfo>>,std::allocator<std::pair<CPubKey,KeyOriginInfo>>>
                    *)__return_storage_ptr__,(pair<CPubKey,_KeyOriginInfo> *)__v);
      }
      else {
        local_118 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_110 = "";
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        local_120 = &boost::unit_test::basic_cstring<char_const>::null;
        file.m_end = (iterator)0x77;
        file.m_begin = (iterator)&local_118;
        msg.m_end = in_R9;
        msg.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_128,
                   msg);
        local_148.m_empty = false;
        local_148._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
        local_138 = boost::unit_test::lazy_ostream::inst;
        local_130 = "";
        bVar3 = *(byte *)__v & 0xfe;
        local_14c = 0x21;
        if (bVar3 != 2) {
          bVar5 = *(byte *)__v - 4;
          local_14c = 0;
          if (bVar5 < 4) {
            local_14c = *(undefined4 *)(&DAT_00e80160 + (ulong)bVar5 * 4);
          }
        }
        local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(bVar3 == 2);
        local_150 = 0x21;
        local_e8.m_message.px = (element_type *)0x0;
        local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_f8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
        ;
        local_f0 = "";
        local_100 = &local_14c;
        norm_pubkey.vch[8] = '\0';
        norm_pubkey.vch._0_8_ = &PTR__lazy_ostream_013abbb0;
        norm_pubkey.vch._16_8_ = boost::unit_test::lazy_ostream::inst;
        norm_pubkey.vch._24_8_ = &local_100;
        local_108 = &local_150;
        norm_origin.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = 0;
        norm_origin._0_8_ = &PTR__lazy_ostream_013abcf0;
        norm_origin.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)boost::unit_test::lazy_ostream::inst;
        norm_origin.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&local_108;
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  (&local_e8,&local_148,1,2,REQUIRE,0xe94f28,(size_t)&local_f8,0x77,&norm_pubkey,
                   "33",&norm_origin);
        boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
        bVar3 = *(byte *)__v;
        if ((bVar3 & 0xfe) == 2) {
          __n = 0x21;
LAB_003c241b:
          bVar2 = false;
        }
        else {
          if ((bVar3 < 8) && ((0xd0U >> (bVar3 & 0x1f) & 1) != 0)) {
            __n = 0x41;
            goto LAB_003c241b;
          }
          bVar2 = true;
          __n = 0;
        }
        if (!bVar2) {
          memmove(bytes,__v,__n);
        }
        bytes[0] = '\x02';
        CPubKey::Set<unsigned_char_const*>(&norm_pubkey,bytes,local_47);
        norm_origin.fingerprint = (uchar  [4])p_Var4[4]._M_color;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&norm_origin.path,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var4[4]._M_parent);
        norm_origin._0_8_ = (ulong)(uint)norm_origin._4_4_ << 0x20;
        std::
        _Rb_tree<std::pair<CPubKey,KeyOriginInfo>,std::pair<CPubKey,KeyOriginInfo>,std::_Identity<std::pair<CPubKey,KeyOriginInfo>>,std::less<std::pair<CPubKey,KeyOriginInfo>>,std::allocator<std::pair<CPubKey,KeyOriginInfo>>>
        ::_M_emplace_unique<CPubKey&,KeyOriginInfo&>
                  ((_Rb_tree<std::pair<CPubKey,KeyOriginInfo>,std::pair<CPubKey,KeyOriginInfo>,std::_Identity<std::pair<CPubKey,KeyOriginInfo>>,std::less<std::pair<CPubKey,KeyOriginInfo>>,std::allocator<std::pair<CPubKey,KeyOriginInfo>>>
                    *)__return_storage_ptr__,&norm_pubkey,&norm_origin);
        pvVar1 = (void *)CONCAT71(norm_origin.path.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                  norm_origin.path.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_1_);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,(long)norm_origin.path.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar1);
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<std::pair<CPubKey, KeyOriginInfo>> GetKeyOriginData(const FlatSigningProvider& provider, int flags) {
    std::set<std::pair<CPubKey, KeyOriginInfo>> ret;
    for (const auto& [_, data] : provider.origins) {
        if (flags & XONLY_KEYS) {
            unsigned char bytes[33];
            BOOST_CHECK_EQUAL(data.first.size(), 33);
            std::copy(data.first.begin(), data.first.end(), bytes);
            bytes[0] = 0x02;
            CPubKey norm_pubkey{bytes};
            KeyOriginInfo norm_origin = data.second;
            std::fill(std::begin(norm_origin.fingerprint), std::end(norm_origin.fingerprint), 0); // fingerprints don't necessarily match.
            ret.emplace(norm_pubkey, norm_origin);
        } else {
            ret.insert(data);
        }
    }
    return ret;
}